

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O0

void __thiscall Assimp::COB::Node::~Node(Node *this)

{
  Node *this_local;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_00ee38f8;
  std::__cxx11::string::~string((string *)&this->name);
  std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::~deque
            (&this->temp_children);
  return;
}

Assistant:

virtual ~Node() {}